

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pray.c
# Opt level: O1

int in_trouble(void)

{
  uint uVar1;
  boolean bVar2;
  int iVar3;
  obj *poVar4;
  long lVar5;
  int iVar6;
  uint x;
  int iVar7;
  int iVar8;
  
  iVar3 = 0xd;
  if (((((u.uprops[0x21].intrinsic == 0) && (iVar3 = 0xc, u.uprops[0x3a].intrinsic == 0)) &&
       (iVar3 = 0xb, u.uprops[0x22].intrinsic == 0)) &&
      ((u.utrap == 0 || (iVar3 = 10, u.utraptype != 3)))) &&
     ((iVar3 = 9, u.uprops[0x1d].intrinsic == 0 && (iVar3 = 8, u.uhs < 3)))) {
    if (u.umonnum == u.umonster) {
      if (u.uhp < 6) {
        return 7;
      }
      if (u.uhp * 7 <= u.uhpmax) {
        return 7;
      }
    }
    else {
      if (u.mh < 6) {
        return 7;
      }
      if (u.mh * 7 <= u.mhmax) {
        return 7;
      }
    }
    iVar3 = 6;
    if ((u.ulycn < 0) &&
       ((iVar3 = near_capacity(), iVar3 < 4 || (iVar3 = 5, (int)u.amax.a[0] - (int)u.acurr.a[0] < 4)
        ))) {
      iVar7 = -1;
      iVar3 = 0;
      do {
        iVar8 = -1;
        do {
          if (iVar8 != 0 || iVar7 != 0) {
            iVar6 = (int)u.ux;
            if ((iVar7 + iVar6) - 1U < 0x4f) {
              uVar1 = iVar8 + u.uy;
              if (uVar1 < 0x15) {
                if ('\x10' < level->locations[(uint)(iVar7 + iVar6)][uVar1].typ) {
                  lVar5 = 0;
                  for (poVar4 = level->objects[(uint)(iVar7 + iVar6)][uVar1]; poVar4 != (obj *)0x0;
                      poVar4 = (poVar4->v).v_nexthere) {
                    if (poVar4->otyp == 0x214) {
                      lVar5 = lVar5 + poVar4->quan;
                    }
                  }
                  if ((lVar5 == 0) ||
                     (((((lVar5 == 1 && ((iVar6 + iVar7 * 2) - 1U < 0x4f)) &&
                        (uVar1 = (int)u.uy + iVar8 * 2, uVar1 < 0x15)) &&
                       ((x = iVar6 + iVar7 * 2, '\x10' < level->locations[x][uVar1].typ &&
                        (poVar4 = sobj_at(0x214,level,x,uVar1), poVar4 == (obj *)0x0)))) ||
                      (((youmonst.data)->mflags2 & 0x8000000) != 0)))) goto LAB_00221b68;
                }
              }
            }
            iVar3 = iVar3 + 1;
          }
LAB_00221b68:
          iVar8 = iVar8 + 1;
        } while (iVar8 != 2);
        iVar7 = iVar7 + 1;
      } while (iVar7 != 2);
      if ((((iVar3 != 8) || (u.uprops[0x3e].intrinsic != 0)) ||
          ((u.uprops[0x3e].extrinsic != 0 || (iVar3 = 4, ((youmonst.data)->mflags1 & 8) != 0)))) &&
         (((uarmf == (obj *)0x0 || (uarmf->otyp != 0x9c)) ||
          (iVar3 = 3, (uarmf->field_0x4a & 1) == 0)))) {
        poVar4 = stuck_ring(uleft,0xaa);
        iVar3 = 3;
        if ((poVar4 == (obj *)0x0) && (poVar4 = stuck_ring(uright,0xaa), poVar4 == (obj *)0x0)) {
          if ((((youmonst.data)->mflags1 & 0x2000) != 0) || (iVar3 = freehand(), iVar3 == 0)) {
            iVar3 = welded(uwep);
            if (iVar3 != 0) {
              return 2;
            }
            if ((u.umonnum != u.umonster) && (((youmonst.data)->mflags1 & 0x2000) != 0)) {
              if (u.uprops[0x3d].extrinsic == 0 && u.uprops[0x3d].intrinsic == 0) {
                return 2;
              }
              poVar4 = unchanger();
              if ((poVar4 != (obj *)0x0) && ((poVar4->field_0x4a & 1) != 0)) {
                return 2;
              }
            }
          }
          if ((((((ublindf == (obj *)0x0) || (ublindf->otyp == 0xed)) ||
                (iVar3 = 1, (ublindf->field_0x4a & 1) == 0)) && (iVar3 = -1, uball == (obj *)0x0))
              && (((uarmg == (obj *)0x0 || (uarmg->otyp != 0x90)) ||
                  (iVar3 = -2, (uarmg->field_0x4a & 1) == 0)))) &&
             (((uarmf == (obj *)0x0 || (uarmf->otyp != 0x9b)) ||
              (iVar3 = -2, (uarmf->field_0x4a & 1) == 0)))) {
            poVar4 = worst_cursed_item();
            iVar3 = -3;
            if ((poVar4 == (obj *)0x0) &&
               (((((u.usteed == (monst *)0x0 ||
                   (poVar4 = which_armor(u.usteed,0x100000), poVar4 == (obj *)0x0)) ||
                  (poVar4->otyp != 0xf0)) || (iVar3 = -4, (poVar4->field_0x4a & 1) == 0)) &&
                ((u.uprops[0x1e].intrinsic < 2 ||
                 (iVar3 = -5, ((youmonst.data)->mflags1 & 0x1000) != 0)))))) {
              lVar5 = -6;
              do {
                if (u.aexe.a[lVar5] < u.atemp.a[lVar5]) {
                  return -6;
                }
                lVar5 = lVar5 + 1;
              } while (lVar5 != 0);
              if ((((u.uprops[0x20].extrinsic == 0 && u.uprops[0x20].intrinsic == 0) ||
                   (iVar3 = -7, u.usteed != (monst *)0x0)) &&
                  ((iVar3 = -8, u.uhs < 2 &&
                   ((iVar3 = -9, u.uprops[0x1b].intrinsic == 0 &&
                    (iVar3 = -10, u.uprops[0x1c].intrinsic == 0)))))) &&
                 ((u.uprops[0x23].intrinsic == 0 ||
                  ((u.uprops[0x24].extrinsic != 0 ||
                   ((iVar3 = -0xb, u.umonnum != u.umonster &&
                    (bVar2 = dmgtype(youmonst.data,0x24), bVar2 != '\0')))))))) {
                iVar3 = 0;
              }
            }
          }
        }
      }
    }
  }
  return iVar3;
}

Assistant:

int in_trouble(void)
{
	struct obj *otmp;
	int i, j, count=0;

	/*
	 * major troubles
	 */
	if (Stoned) return TROUBLE_STONED;
	if (Slimed) return TROUBLE_SLIMED;
	if (Strangled) return TROUBLE_STRANGLED;
	if (u.utrap && u.utraptype == TT_LAVA) return TROUBLE_LAVA;
	if (Sick) return TROUBLE_SICK;
	if (u.uhs >= WEAK) return TROUBLE_STARVING;
	if (Upolyd ? (u.mh <= 5 || u.mh*7 <= u.mhmax) :
		(u.uhp <= 5 || u.uhp*7 <= u.uhpmax)) return TROUBLE_HIT;
	if (u.ulycn >= LOW_PM) return TROUBLE_LYCANTHROPE;
	if (near_capacity() >= EXT_ENCUMBER && AMAX(A_STR)-ABASE(A_STR) > 3)
		return TROUBLE_COLLAPSING;

	for (i= -1; i<=1; i++) for (j= -1; j<=1; j++) {
		if (!i && !j) continue;
		if (!isok(u.ux+i, u.uy+j) || IS_ROCK(level->locations[u.ux+i][u.uy+j].typ)
		    || (blocked_boulder(i,j) && !throws_rocks(youmonst.data)))
			count++;
	}
	if (count == 8 && !Passes_walls)
		return TROUBLE_STUCK_IN_WALL;

	if (Cursed_obj(uarmf, LEVITATION_BOOTS) ||
		stuck_ring(uleft, RIN_LEVITATION) ||
		stuck_ring(uright, RIN_LEVITATION))
		return TROUBLE_CURSED_LEVITATION;
	if (nohands(youmonst.data) || !freehand()) {
	    /* for bag/box access [cf use_container()]...
	       make sure it's a case that we know how to handle;
	       otherwise "fix all troubles" would get stuck in a loop */
	    if (welded(uwep)) return TROUBLE_UNUSEABLE_HANDS;
	    if (Upolyd && nohands(youmonst.data) && (!Unchanging ||
		    ((otmp = unchanger()) != 0 && otmp->cursed)))
		return TROUBLE_UNUSEABLE_HANDS;
	}
	if (Blindfolded && ublindf->cursed) return TROUBLE_CURSED_BLINDFOLD;

	/*
	 * minor troubles
	 */
	if (Punished) return TROUBLE_PUNISHED;
	if (Cursed_obj(uarmg, GAUNTLETS_OF_FUMBLING) ||
		Cursed_obj(uarmf, FUMBLE_BOOTS))
	    return TROUBLE_FUMBLING;
	if (worst_cursed_item()) return TROUBLE_CURSED_ITEMS;
	if (u.usteed) {	/* can't voluntarily dismount from a cursed saddle */
	    otmp = which_armor(u.usteed, W_SADDLE);
	    if (Cursed_obj(otmp, SADDLE)) return TROUBLE_SADDLE;
	}

	if (Blinded > 1 && haseyes(youmonst.data)) return TROUBLE_BLIND;
	for (i=0; i<A_MAX; i++)
	    if (ABASE(i) < AMAX(i)) return TROUBLE_POISONED;
	if (Wounded_legs && !u.usteed)
		return TROUBLE_WOUNDED_LEGS;
	if (u.uhs >= HUNGRY) return TROUBLE_HUNGRY;
	if (HStun) return TROUBLE_STUNNED;
	if (HConfusion) return TROUBLE_CONFUSED;
	if (Hallucination) return TROUBLE_HALLUCINATION;
	return 0;
}